

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O1

size_t __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>_>
::Count(IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>_>
        *this)

{
  function<bool_(const_int_&)> *pfVar1;
  map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  bool bVar2;
  size_t sVar3;
  iterator __end0;
  iterator __begin0;
  OUT local_1e8;
  iterator local_1c8;
  iterator local_140;
  iterator local_b8;
  
  begin(&local_b8,this);
  end(&local_140,this);
  pfVar1 = &local_1c8.source.transformer;
  this_00 = &local_1c8.source.result;
  sVar3 = 0;
  while( true ) {
    local_1c8.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
         (_func_int **)&PTR_Init_00159b40;
    local_1c8.source.source.source.super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00158250;
    local_1c8.source.source.source.end._M_current = local_140.source.source.source.end._M_current;
    local_1c8.source.source.source.source = local_140.source.source.source.source;
    local_1c8.source.source.source.current._M_current =
         local_140.source.source.source.current._M_current;
    std::function<bool_(const_int_&)>::function(pfVar1,&local_140.source.transformer);
    std::
    _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::_Rb_tree(&this_00->_M_t,&local_140.source.result._M_t);
    local_1c8.source.current._M_node = local_140.source.current._M_node;
    local_1c8.valid = local_140.valid;
    bVar2 = iterator::operator!=(&local_b8,&local_1c8);
    local_1c8.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
         (_func_int **)&PTR_Init_00159b40;
    std::
    _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&this_00->_M_t);
    if (local_1c8.source.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1c8.source.transformer.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    if (!bVar2) break;
    GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
    ::Current(&local_1e8,&local_b8.source);
    local_1e8.super_IEnumerable<int_&>.super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00158638;
    if (local_1e8.super_IEnumerable<int_&>.state.
        super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.super_IEnumerable<int_&>.state.
                 super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_b8.source.current._M_node =
         (_Base_ptr)std::_Rb_tree_increment(local_b8.source.current._M_node);
    local_b8.valid =
         local_b8.source.current._M_node !=
         &local_b8.source.result._M_t._M_impl.super__Rb_tree_header._M_header;
    sVar3 = sVar3 + 1;
  }
  local_140.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_00159b40;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_140.source.result._M_t);
  if (local_140.source.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_140.source.transformer;
    (*local_140.source.transformer.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  local_b8.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_00159b40;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_b8.source.result._M_t);
  if (local_b8.source.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_b8.source.transformer;
    (*local_b8.source.transformer.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  return sVar3;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}